

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.hpp
# Opt level: O1

bool __thiscall tl::StrT<char32_t>::operator!=(StrT<char32_t> *this,CStrT<char32_t> o)

{
  bool bVar1;
  
  bVar1 = operator==(this,o);
  return !bVar1;
}

Assistant:

bool operator!=(CStrT<CharT> o)const { return !(*this == o); }